

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

FunctionMatch * __thiscall
Jinx::Impl::Parser::CheckFunctionCall
          (FunctionMatch *__return_storage_ptr__,Parser *this,LibraryIPtr *library,
          SymbolListCItr currSym,SymbolListCItr endSym,bool skipInitialParam)

{
  pointer ppFVar1;
  SymbolListCItr currentSymbol;
  FunctionMatch newMatch;
  FunctionPtrList functionPtrList;
  FunctionMatch local_68;
  _Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
  local_48;
  
  Library::Functions((FunctionPtrList *)&local_48,
                     (library->super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  (__return_storage_ptr__->partData).
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->partData).
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->signature = (FunctionSignature *)0x0;
  (__return_storage_ptr__->partData).
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_48._M_impl.super__Vector_impl_data._M_start !=
      local_48._M_impl.super__Vector_impl_data._M_finish) {
    ppFVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
    do {
      CheckFunctionCall(&local_68,this,*ppFVar1,currSym,endSym,skipInitialParam);
      if ((local_68.signature != (FunctionSignature *)0x0) &&
         ((__return_storage_ptr__->signature == (FunctionSignature *)0x0 ||
          ((ulong)((long)(__return_storage_ptr__->partData).
                         super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->partData).
                        super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) <
           (ulong)((long)local_68.partData.
                         super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.partData.
                        super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_start))))) {
        __return_storage_ptr__->signature = local_68.signature;
        std::
        vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::operator=(&__return_storage_ptr__->partData,&local_68.partData);
      }
      std::
      _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::~_Vector_base(&local_68.partData.
                       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                     );
      ppFVar1 = ppFVar1 + 1;
    } while (ppFVar1 != local_48._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
  ::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline_t Parser::FunctionMatch Parser::CheckFunctionCall(LibraryIPtr library, SymbolListCItr currSym, SymbolListCItr endSym, bool skipInitialParam) const
	{
		const auto functionPtrList = library->Functions();

		FunctionMatch match;
		for (const auto functionSig : functionPtrList)
		{
			auto currentSymbol = currSym;
			auto newMatch = CheckFunctionCall(*functionSig, currentSymbol, endSym, skipInitialParam);
			if (newMatch.signature)
			{
				if (!match.signature || match.partData.size() < newMatch.partData.size())
					match = newMatch;
			}
		}
		return match;
	}